

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall CSlidingBucket::~CSlidingBucket(CSlidingBucket *this)

{
  AbstractSearchState **__ptr;
  long lVar1;
  
  if (0 < this->numofbuckets) {
    lVar1 = 0;
    do {
      __ptr = this->bucketV[lVar1];
      if (__ptr != (AbstractSearchState **)0x0) {
        if (this->initialdynamicsize == 0) {
          operator_delete__(__ptr);
        }
        else {
          free(__ptr);
        }
        this->bucketV[lVar1] = (AbstractSearchState **)0x0;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->numofbuckets);
  }
  if ((this->initialdynamicsize != 0) && (this->dynamicsize != (int *)0x0)) {
    operator_delete__(this->dynamicsize);
  }
  if (this->bucketV != (AbstractSearchState ***)0x0) {
    operator_delete__(this->bucketV);
  }
  this->bucketV = (AbstractSearchState ***)0x0;
  if (this->lastelementindexV != (int *)0x0) {
    operator_delete__(this->lastelementindexV);
    return;
  }
  return;
}

Assistant:

~CSlidingBucket()
    {
        for (int i = 0; i < numofbuckets; i++) {
            if (bucketV[i] != NULL) {
                if(initialdynamicsize)
                  free(bucketV[i]);
                else
                  delete[] bucketV[i];
                bucketV[i] = NULL;
            }
        }
        if(initialdynamicsize)
          delete [] dynamicsize;

        delete[] bucketV;
        bucketV = NULL;
        delete[] lastelementindexV;
    }